

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O0

void EDCircles::addArc(MyArc *arcs,int *noArcs,double xc,double yc,double r,double circleFitError,
                      double sTheta,double eTheta,int turn,int segmentNo,EllipseEquation *pEq,
                      double ellipseFitError,int sx,int sy,int ex,int ey,double *x,double *y,
                      int noPixels,double overlapRatio)

{
  double dVar1;
  double overlapRatio_local;
  int sx_local;
  double ellipseFitError_local;
  EllipseEquation *pEq_local;
  int segmentNo_local;
  int turn_local;
  double eTheta_local;
  double sTheta_local;
  double circleFitError_local;
  double r_local;
  double yc_local;
  double xc_local;
  int *noArcs_local;
  MyArc *arcs_local;
  
  arcs[*noArcs].xc = xc;
  arcs[*noArcs].yc = yc;
  arcs[*noArcs].r = r;
  arcs[*noArcs].circleFitError = circleFitError;
  arcs[*noArcs].sTheta = sTheta;
  arcs[*noArcs].eTheta = eTheta;
  dVar1 = computeEllipsePerimeter(pEq);
  arcs[*noArcs].coverRatio = ((1.0 - overlapRatio) * (double)noPixels) / dVar1;
  arcs[*noArcs].turn = turn;
  arcs[*noArcs].segmentNo = segmentNo;
  arcs[*noArcs].isEllipse = true;
  memcpy(&arcs[*noArcs].eq,pEq,0x38);
  arcs[*noArcs].ellipseFitError = ellipseFitError;
  arcs[*noArcs].sx = sx;
  arcs[*noArcs].sy = sy;
  arcs[*noArcs].ex = ex;
  arcs[*noArcs].ey = ey;
  arcs[*noArcs].x = x;
  arcs[*noArcs].y = y;
  arcs[*noArcs].noPixels = noPixels;
  *noArcs = *noArcs + 1;
  return;
}

Assistant:

void EDCircles::addArc(MyArc * arcs, int & noArcs, double xc, double yc, double r, double circleFitError, double sTheta, double eTheta, int turn, int segmentNo, EllipseEquation * pEq, double ellipseFitError, int sx, int sy, int ex, int ey, double * x, double * y, int noPixels, double overlapRatio)
{
	arcs[noArcs].xc = xc;
	arcs[noArcs].yc = yc;
	arcs[noArcs].r = r;
	arcs[noArcs].circleFitError = circleFitError;

	arcs[noArcs].sTheta = sTheta;
	arcs[noArcs].eTheta = eTheta;
	arcs[noArcs].coverRatio = (double)((1.0 - overlapRatio)*noPixels) / computeEllipsePerimeter(pEq);
	//  arcs[noArcs].coverRatio = noPixels/ComputeEllipsePerimeter(pEq);
	//  arcs[noArcs].coverRatio = ArcLength(sTheta, eTheta)/(TWOPI);
	
	arcs[noArcs].turn = turn;

	arcs[noArcs].segmentNo = segmentNo;

	arcs[noArcs].isEllipse = true;
	arcs[noArcs].eq = *pEq;
	arcs[noArcs].ellipseFitError = ellipseFitError;

	arcs[noArcs].sx = sx;
	arcs[noArcs].sy = sy;
	arcs[noArcs].ex = ex;
	arcs[noArcs].ey = ey;

	arcs[noArcs].x = x;
	arcs[noArcs].y = y;
	arcs[noArcs].noPixels = noPixels;

	noArcs++;
}